

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O2

void __thiscall EDColor::ComputeGradientMapByDiZenzo(EDColor *this)

{
  uchar *puVar1;
  uchar *puVar2;
  short *psVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double __x;
  int local_74;
  
  iVar6 = 0;
  memset(this->gradImg,0,(long)this->height * (long)this->width * 2);
  local_74 = 2;
  iVar16 = 0;
  iVar21 = 1;
  while( true ) {
    iVar4 = this->width;
    if (this->height + -1 <= iVar21) break;
    for (lVar20 = 0; iVar5 = (int)lVar20, iVar5 + 1 < iVar4 + -1; lVar20 = lVar20 + 1) {
      iVar9 = local_74 * iVar4;
      iVar19 = iVar9 + iVar5;
      iVar12 = iVar9 + iVar5 + 1;
      iVar9 = iVar5 + 2 + iVar9;
      puVar1 = this->smooth_L;
      puVar2 = this->smooth_a;
      iVar10 = iVar6 * iVar4;
      iVar18 = iVar10 + iVar5;
      iVar22 = iVar10 + iVar5 + 1;
      iVar10 = iVar10 + iVar5 + 2;
      iVar15 = iVar4 * iVar21 + iVar5;
      iVar4 = iVar4 * iVar21 + iVar5 + 2;
      iVar11 = ((uint)puVar1[iVar4] - (uint)puVar1[iVar15]) +
               ((uint)puVar1[iVar10] - (uint)puVar1[iVar19]) +
               ((uint)puVar1[iVar9] - (uint)puVar1[iVar18]);
      iVar5 = ((uint)puVar1[iVar12] - (uint)puVar1[iVar22]) +
              (((uint)puVar1[iVar9] - (uint)puVar1[iVar18]) -
              ((uint)puVar1[iVar10] - (uint)puVar1[iVar19]));
      iVar17 = ((uint)puVar2[iVar4] - (uint)puVar2[iVar15]) +
               ((uint)puVar2[iVar10] - (uint)puVar2[iVar19]) +
               ((uint)puVar2[iVar9] - (uint)puVar2[iVar18]);
      iVar13 = ((uint)puVar2[iVar12] - (uint)puVar2[iVar22]) +
               (((uint)puVar2[iVar9] - (uint)puVar2[iVar18]) -
               ((uint)puVar2[iVar10] - (uint)puVar2[iVar19]));
      puVar1 = this->smooth_b;
      iVar15 = ((uint)puVar1[iVar4] - (uint)puVar1[iVar15]) +
               ((uint)puVar1[iVar10] - (uint)puVar1[iVar19]) +
               ((uint)puVar1[iVar9] - (uint)puVar1[iVar18]);
      iVar10 = ((uint)puVar1[iVar12] - (uint)puVar1[iVar22]) +
               (((uint)puVar1[iVar9] - (uint)puVar1[iVar18]) -
               ((uint)puVar1[iVar10] - (uint)puVar1[iVar19]));
      iVar9 = iVar15 * iVar15 + iVar17 * iVar17 + iVar11 * iVar11;
      iVar4 = iVar10 * iVar10 + iVar13 * iVar13 + iVar5 * iVar5;
      __x = (double)(iVar9 - iVar4);
      iVar5 = iVar10 * iVar15 + iVar13 * iVar17 + iVar5 * iVar11;
      dVar23 = (double)iVar5;
      dVar23 = atan2(dVar23 + dVar23,__x);
      dVar23 = dVar23 * 0.5;
      dVar24 = cos(dVar23 + dVar23);
      dVar25 = sin(dVar23 + dVar23);
      dVar24 = (dVar25 * (double)(iVar5 * 2) + dVar24 * __x + (double)(iVar4 + iVar9)) * 0.5;
      if (dVar24 < 0.0) {
        dVar24 = sqrt(dVar24);
      }
      else {
        dVar24 = SQRT(dVar24);
      }
      iVar5 = (int)(dVar24 + 0.5);
      this->dirImg[lVar20 + 1 + (long)iVar21 * (long)this->width] =
           (0.7853975 < ABS(dVar23)) + '\x01';
      iVar4 = this->width;
      this->gradImg[iVar21 * iVar4 + lVar20 + 1] = (short)iVar5;
      if (iVar16 <= iVar5) {
        iVar16 = iVar5;
      }
    }
    local_74 = local_74 + 1;
    iVar6 = iVar6 + 1;
    iVar21 = iVar21 + 1;
  }
  uVar7 = iVar4 * this->height;
  psVar3 = this->gradImg;
  uVar14 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar14;
  }
  for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
    psVar3[uVar14] = (short)(int)((double)(int)psVar3[uVar14] * (255.0 / (double)iVar16));
  }
  return;
}

Assistant:

void EDColor::ComputeGradientMapByDiZenzo()
{
	memset(gradImg, 0, sizeof(short)*width*height);

	int max = 0;

	for (int i = 1; i < height - 1; i++) {
		for (int j = 1; j < width - 1; j++) {
#if 1
			// Prewitt for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Prewitt for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Prewitt for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#else
			// Sobel for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + 2 * (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + 2 * (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Sobel for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + 2 * (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + 2 * (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Sobel for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + 2 * (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + 2 * (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#endif
			int gxx = gxCh1*gxCh1 + gxCh2*gxCh2 + gxCh3*gxCh3;
			int gyy = gyCh1*gyCh1 + gyCh2*gyCh2 + gyCh3*gyCh3;
			int gxy = gxCh1*gyCh1 + gxCh2*gyCh2 + gxCh3*gyCh3;

#if 1
			// Di Zenzo's formulas from Gonzales & Woods - Page 337
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction
			int grad = (int)(sqrt(((gxx + gyy) + (gxx - gyy)*cos(2 * theta) + 2 * gxy*sin(2 * theta)) / 2.0) + 0.5); // Gradient Magnitude
#else
			// Koschan & Abidi - 2005 - Signal Processing Magazine
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction

			double cosTheta = cos(theta);
			double sinTheta = sin(theta);
			int grad = (int)(sqrt(gxx*cosTheta*cosTheta + 2 * gxy*sinTheta*cosTheta + gyy*sinTheta*sinTheta) + 0.5); // Gradient Magnitude
#endif

			// Gradient is perpendicular to the edge passing through the pixel	
			if (theta >= -3.14159 / 4 && theta <= 3.14159 / 4)
				dirImg[i*width + j] = EDGE_VERTICAL;
			else
				dirImg[i*width + j] = EDGE_HORIZONTAL;

			gradImg[i*width + j] = grad;
			if (grad > max) max = grad;

		}
	} // end outer for

	// Scale the gradient values to 0-255
	double scale = 255.0 / max;
	for (int i = 0; i<width*height; i++)
		gradImg[i] = (short)(gradImg[i] * scale);
}